

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiStorage::SetFloat(ImGuiStorage *this,ImGuiID key,float val)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  ImGuiStoragePair *__dest;
  int iVar4;
  ulong uVar5;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ImGuiStoragePair *pIVar10;
  long lVar11;
  ulong uVar6;
  
  iVar2 = (this->Data).Size;
  uVar3 = (ulong)iVar2;
  __dest = (this->Data).Data;
  uVar6 = uVar3;
  pIVar10 = __dest;
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    do {
      uVar5 = uVar6 >> 1;
      uVar7 = uVar5;
      if (pIVar10[uVar5].key < key) {
        uVar7 = ~uVar5 + uVar6;
        pIVar10 = pIVar10 + uVar5 + 1;
      }
      uVar6 = uVar7;
    } while (uVar7 != 0);
  }
  if ((pIVar10 == __dest + uVar3) || (pIVar10->key != key)) {
    lVar11 = (long)pIVar10 - (long)__dest;
    if (iVar2 == (this->Data).Capacity) {
      if (iVar2 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar2 / 2 + iVar2;
      }
      iVar9 = iVar2 + 1;
      if (iVar2 + 1 < iVar4) {
        iVar9 = iVar4;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiStoragePair *)(*GImAllocatorAllocFunc)((long)iVar9 << 4,GImAllocatorUserData);
      pIVar10 = (this->Data).Data;
      if (pIVar10 != (ImGuiStoragePair *)0x0) {
        memcpy(__dest,pIVar10,(long)(this->Data).Size << 4);
        pIVar10 = (this->Data).Data;
        if ((pIVar10 != (ImGuiStoragePair *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar10,GImAllocatorUserData);
      }
      (this->Data).Data = __dest;
      (this->Data).Capacity = iVar9;
      uVar3 = (ulong)(this->Data).Size;
    }
    lVar8 = uVar3 - (lVar11 >> 4);
    if (lVar8 != 0 && lVar11 >> 4 <= (long)uVar3) {
      memmove((void *)((long)__dest + lVar11 + 0x10),(void *)((long)__dest + lVar11),lVar8 * 0x10);
      __dest = (this->Data).Data;
    }
    *(ImGuiID *)((long)__dest + lVar11) = key;
    *(float *)((long)__dest + lVar11 + 8) = val;
    (this->Data).Size = (this->Data).Size + 1;
  }
  else {
    (pIVar10->field_1).val_f = val;
  }
  return;
}

Assistant:

void ImGuiStorage::SetFloat(ImGuiID key, float val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, ImGuiStoragePair(key, val));
        return;
    }
    it->val_f = val;
}